

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O0

int Gia_ManFromIfLogicAndVars
              (Gia_Man_t *pNew,If_Man_t *pIfMan,If_Cut_t *pCutBest,Vec_Int_t *vLeaves,
              Vec_Int_t *vLeaves2,Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  uint fCompl;
  int iVar4;
  int Entry;
  word *pIn;
  Gia_Obj_t *pObj;
  ulong local_298;
  ulong local_290;
  int RetValue;
  int fOrDec;
  int iTemp;
  int iLitCofs [2];
  int MaskOne [2];
  int Mask;
  int k;
  int c;
  int truthId;
  int nLeaves;
  word uTruth [2];
  word pFunc [64];
  Vec_Int_t *vCover_local;
  Vec_Int_t *vLeaves2_local;
  Vec_Int_t *vLeaves_local;
  If_Cut_t *pCutBest_local;
  If_Man_t *pIfMan_local;
  Gia_Man_t *pNew_local;
  
  uVar1 = *(uint *)&pCutBest->field_0x1c >> 0x18;
  iVar2 = Abc_Lit2Var(pCutBest->iCutFunc);
  uVar3 = Vec_IntEntry(pIfMan->vTtDecs[(int)uVar1],iVar2);
  iLitCofs[0] = uVar3 & 0xffff;
  iLitCofs[1] = (int)uVar3 >> 0x10 & 0x3fff;
  fCompl = (int)uVar3 >> 0x1e & 1;
  if (((0 < (int)uVar3) &&
      (iVar2 = pIfMan->pPars->nLutSize / 2, uVar3 = iVar2 * 2,
      uVar1 == uVar3 || SBORROW4(uVar1,uVar3) != (int)(uVar1 + iVar2 * -2) < 0)) &&
     (pIfMan->pPars->nLutSize < 0xe)) {
    pIn = If_CutTruthWR(pIfMan,pCutBest);
    Abc_TtCopy(uTruth + 1,pIn,pIfMan->nTruth6Words[(int)uVar1],fCompl);
    Abc_TtDeriveBiDec(uTruth + 1,uVar1,iLitCofs[0],iLitCofs[1],pIfMan->pPars->nLutSize / 2,
                      (word *)&truthId,uTruth);
    if (fCompl == 0) {
      local_290 = _truthId;
    }
    else {
      local_290 = _truthId ^ 0xffffffffffffffff;
    }
    _truthId = local_290;
    if (fCompl == 0) {
      local_298 = uTruth[0];
    }
    else {
      local_298 = uTruth[0] ^ 0xffffffffffffffff;
    }
    uTruth[0] = local_298;
    Mask = 0;
    while( true ) {
      if (1 < Mask) {
        fOrDec = Abc_LitNotCond(fOrDec,fCompl);
        iTemp = Abc_LitNotCond(iTemp,fCompl);
        iVar2 = Gia_ManAppendAnd(pNew,fOrDec,iTemp);
        uVar1 = Abc_LitIsCompl(pCutBest->iCutFunc);
        iVar2 = Abc_LitNotCond(iVar2,fCompl ^ uVar1);
        iVar4 = Abc_Lit2Var(iVar2);
        Entry = Vec_IntSize(vMapping2);
        Vec_IntSetEntry(vMapping,iVar4,Entry);
        Vec_IntPush(vMapping2,2);
        iVar4 = Abc_Lit2Var(fOrDec);
        Vec_IntPush(vMapping2,iVar4);
        iVar4 = Abc_Lit2Var(iTemp);
        Vec_IntPush(vMapping2,iVar4);
        iVar4 = Abc_Lit2Var(iVar2);
        Vec_IntPush(vMapping2,-iVar4);
        iVar2 = Abc_LitNotCond(iVar2,*(uint *)&pCutBest->field_0x1c >> 0xc & 1);
        return iVar2;
      }
      Vec_IntClear(vLeaves2);
      for (MaskOne[1] = 0; MaskOne[1] < (int)uVar1; MaskOne[1] = MaskOne[1] + 1) {
        if ((iLitCofs[Mask] >> ((byte)MaskOne[1] & 0x1f) & 1U) != 0) {
          iVar2 = Vec_IntEntry(vLeaves,MaskOne[1]);
          Vec_IntPush(vLeaves2,iVar2);
        }
      }
      iVar2 = Vec_IntSize(vLeaves2);
      if (iVar2 < 1) break;
      iVar2 = Vec_IntSize(vLeaves2);
      iVar2 = Kit_TruthToGia(pNew,(uint *)(&truthId + (long)Mask * 2),iVar2,vCover,vLeaves2,0);
      (&fOrDec)[Mask] = iVar2;
      iVar2 = Vec_IntSize(vLeaves2);
      if (iVar2 != 1) {
        iVar2 = Abc_Lit2Var((&fOrDec)[Mask]);
        pObj = Gia_ManObj(pNew,iVar2);
        iVar2 = Gia_ObjIsAnd(pObj);
        if (iVar2 == 0) {
          __assert_fail("Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c])))",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                        ,0x6d6,
                        "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                       );
        }
        iVar2 = Abc_Lit2Var((&fOrDec)[Mask]);
        iVar4 = Vec_IntSize(vMapping2);
        Vec_IntSetEntry(vMapping,iVar2,iVar4);
        iVar2 = Vec_IntSize(vLeaves2);
        Vec_IntPush(vMapping2,iVar2);
        for (MaskOne[1] = 0; iVar2 = Vec_IntSize(vLeaves2), MaskOne[1] < iVar2;
            MaskOne[1] = MaskOne[1] + 1) {
          iVar2 = Vec_IntEntry(vLeaves2,MaskOne[1]);
          iVar2 = Abc_Lit2Var(iVar2);
          Vec_IntPush(vMapping2,iVar2);
        }
        iVar2 = Abc_Lit2Var((&fOrDec)[Mask]);
        Vec_IntPush(vMapping2,iVar2);
      }
      Mask = Mask + 1;
    }
    __assert_fail("Vec_IntSize(vLeaves2) >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                  ,0x6d1,
                  "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
                 );
  }
  __assert_fail("Mask > 0 && nLeaves <= 2 * (pIfMan->pPars->nLutSize/2) && pIfMan->pPars->nLutSize <= 13"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaIf.c"
                ,0x6c6,
                "int Gia_ManFromIfLogicAndVars(Gia_Man_t *, If_Man_t *, If_Cut_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *, Vec_Int_t *)"
               );
}

Assistant:

int Gia_ManFromIfLogicAndVars( Gia_Man_t * pNew, If_Man_t * pIfMan, If_Cut_t * pCutBest, Vec_Int_t * vLeaves, Vec_Int_t * vLeaves2, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2 )
{
    word pFunc[64], uTruth[2];
    int nLeaves = pCutBest->nLeaves;
    int truthId = Abc_Lit2Var(pCutBest->iCutFunc);
    int c, k, Mask = Vec_IntEntry(pIfMan->vTtDecs[nLeaves], truthId);
    int MaskOne[2] = { Mask & 0xFFFF, (Mask >> 16) & 0x3FFF };
    int iLitCofs[2], iTemp, fOrDec = (Mask >> 30) & 1, RetValue = -1; 
    assert( Mask > 0 && nLeaves <= 2 * (pIfMan->pPars->nLutSize/2) && pIfMan->pPars->nLutSize <= 13 );
    Abc_TtCopy( pFunc, If_CutTruthWR(pIfMan, pCutBest), pIfMan->nTruth6Words[nLeaves], fOrDec );
    Abc_TtDeriveBiDec( pFunc, nLeaves, MaskOne[0], MaskOne[1], pIfMan->pPars->nLutSize/2, &uTruth[0], &uTruth[1] );
    uTruth[0] = fOrDec ? ~uTruth[0] : uTruth[0];
    uTruth[1] = fOrDec ? ~uTruth[1] : uTruth[1];
    for ( c = 0; c < 2; c++ )
    {
        Vec_IntClear( vLeaves2 );
        for ( k = 0; k < nLeaves; k++ )
            if ( (MaskOne[c] >> k) & 1 )
                Vec_IntPush( vLeaves2, Vec_IntEntry(vLeaves, k) );
        assert( Vec_IntSize(vLeaves2) >= 1 );
        iLitCofs[c] = Kit_TruthToGia( pNew, (unsigned *)&uTruth[c], Vec_IntSize(vLeaves2), vCover, vLeaves2, 0 );
        if ( Vec_IntSize(vLeaves2) == 1 )
            continue;
        // create mapping
        assert( Gia_ObjIsAnd(Gia_ManObj(pNew, Abc_Lit2Var(iLitCofs[c]))) );
        Vec_IntSetEntry( vMapping, Abc_Lit2Var(iLitCofs[c]), Vec_IntSize(vMapping2) );
        Vec_IntPush( vMapping2, Vec_IntSize(vLeaves2) );
        Vec_IntForEachEntry( vLeaves2, iTemp, k )
            Vec_IntPush( vMapping2, Abc_Lit2Var(iTemp) );
        Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[c]) );
    }
    iLitCofs[0] = Abc_LitNotCond( iLitCofs[0], fOrDec );
    iLitCofs[1] = Abc_LitNotCond( iLitCofs[1], fOrDec );
    RetValue = Gia_ManAppendAnd( pNew, iLitCofs[0], iLitCofs[1] );
    RetValue = Abc_LitNotCond( RetValue, fOrDec ^ Abc_LitIsCompl(pCutBest->iCutFunc) );
    // create mapping
    Vec_IntSetEntry( vMapping, Abc_Lit2Var(RetValue), Vec_IntSize(vMapping2) );
    Vec_IntPush( vMapping2, 2 );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[0]) );
    Vec_IntPush( vMapping2, Abc_Lit2Var(iLitCofs[1]) );
    Vec_IntPush( vMapping2, -Abc_Lit2Var(RetValue) );
    RetValue = Abc_LitNotCond( RetValue, pCutBest->fCompl );
    return RetValue;
}